

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O0

void Abc_QuickSortTest(void)

{
  int iVar1;
  abctime aVar2;
  word *pData;
  word *pData_00;
  abctime aVar3;
  ulong uVar4;
  abctime clk;
  int i;
  word *pData2;
  word *pData1;
  int fVerbose;
  int nSize;
  
  aVar2 = Abc_Clock();
  pData = (word *)malloc(8000000);
  pData_00 = (word *)malloc(8000000);
  srand(0x457);
  for (clk._4_4_ = 0; clk._4_4_ < 1000000; clk._4_4_ = clk._4_4_ + 1) {
    iVar1 = rand();
    uVar4 = (long)clk._4_4_ << 0x20 | (long)iVar1;
    pData[clk._4_4_] = uVar4;
    pData_00[clk._4_4_] = uVar4;
  }
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"Prepare ",aVar3 - aVar2);
  aVar2 = Abc_Clock();
  Abc_QuickSort3(pData,1000000,1);
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"Sort new",aVar3 - aVar2);
  aVar2 = Abc_Clock();
  Abc_QuickSort1(pData_00,1000000,1);
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"Sort old",aVar3 - aVar2);
  if (pData != (word *)0x0) {
    free(pData);
  }
  if (pData_00 != (word *)0x0) {
    free(pData_00);
  }
  return;
}

Assistant:

void Abc_QuickSortTest()
{
    int nSize = 1000000;
    int fVerbose = 0;
    word * pData1, * pData2;
    int i;
    abctime clk = Abc_Clock();
    // generate numbers
    pData1 = ABC_ALLOC( word, nSize );
    pData2 = ABC_ALLOC( word, nSize );
    srand( 1111 );
    for ( i = 0; i < nSize; i++ )
        pData2[i] = pData1[i] = ((word)i << 32) | rand();
    Abc_PrintTime( 1, "Prepare ", Abc_Clock() - clk );
    // perform sorting
    clk = Abc_Clock();
    Abc_QuickSort3( pData1, nSize, 1 );
    Abc_PrintTime( 1, "Sort new", Abc_Clock() - clk );
    // print the result
    if ( fVerbose )
    {
        for ( i = 0; i < nSize; i++ )
            printf( "(%d,%d) ", (int)(pData1[i] >> 32), (int)pData1[i] );
        printf( "\n" );
    }
    // create new numbers
    clk = Abc_Clock();
    Abc_QuickSort1( pData2, nSize, 1 );
    Abc_PrintTime( 1, "Sort old", Abc_Clock() - clk );
    // print the result
    if ( fVerbose )
    {
        for ( i = 0; i < nSize; i++ )
            printf( "(%d,%d) ", (int)(pData2[i] >> 32), (int)pData2[i] );
        printf( "\n" );
    }
    ABC_FREE( pData1 );
    ABC_FREE( pData2 );
}